

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void BoardTest<uttt::IBoard>(void)

{
  int iVar1;
  vector<long,_std::allocator<long>_> moves_1;
  vector<long,_std::allocator<long>_> moves;
  IBoard game;
  IBoard *in_stack_00000140;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  result_type_conflict1 in_stack_ffffffffffffff94;
  result_type in_stack_ffffffffffffff9c;
  IBoard *in_stack_ffffffffffffffa0;
  vector<long,_std::allocator<long>_> local_58;
  random_device *in_stack_ffffffffffffffd0;
  IBoard local_24;
  IBoard *in_stack_fffffffffffffff8;
  
  if (BoardTest<uttt::IBoard>()::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(in_stack_ffffffffffffffd0);
      __cxa_atexit(std::random_device::~random_device,&BoardTest<uttt::IBoard>::rd,&__dso_handle);
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::rd);
    }
  }
  if (BoardTest<uttt::IBoard>()::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::gen);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff9c = std::random_device::operator()((random_device *)0x1f5088);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::mersenne_twister_engine
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::gen);
    }
  }
  uttt::IBoard::IBoard((IBoard *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uttt::IBoard::Print(in_stack_00000140);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x1f50ce);
  while( true ) {
    iVar1 = uttt::IBoard::GetStatus(&local_24);
    if (iVar1 != -1) break;
    uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffff8);
    std::vector<long,_std::allocator<long>_>::size(&local_58);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff94 =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<long,_std::allocator<long>_>::operator[](&local_58,(long)in_stack_ffffffffffffff94);
    uttt::IBoard::ApplyMove
              (in_stack_ffffffffffffffa0,(IMove *)CONCAT44(in_stack_ffffffffffffff9c,iVar1));
    uttt::IBoard::Print(in_stack_00000140);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffa0);
  }
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void
BoardTest()
{
    static std::random_device rd;
    static std::mt19937 gen(rd());
    IGame game;
    game.Print();
    std::vector<game::IMove> moves;
    while (game.GetStatus() == game::Undecided)
    {
        auto moves = game.GetPossibleMoves();
        game.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        game.Print();
    }
}